

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMChildNode.cpp
# Opt level: O1

DOMNode * __thiscall
xercesc_4_0::DOMChildNode::getPreviousSibling(DOMChildNode *this,DOMNode *thisNode)

{
  long *plVar1;
  long lVar2;
  DOMNode *pDVar3;
  DOMException *this_00;
  
  if (thisNode == (DOMNode *)0x0) {
    plVar1 = (long *)0x0;
  }
  else {
    plVar1 = (long *)__dynamic_cast(thisNode,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                    0xfffffffffffffffe);
  }
  if (plVar1 != (long *)0x0) {
    lVar2 = (**(code **)(*plVar1 + 0x18))(plVar1);
    if (lVar2 != 0) {
      lVar2 = (**(code **)(*plVar1 + 0x18))(plVar1);
      if ((*(ushort *)(lVar2 + 0x10) & 0x10) == 0) {
        pDVar3 = this->previousSibling;
      }
      else {
        pDVar3 = (DOMNode *)0x0;
      }
      return pDVar3;
    }
  }
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMNode * DOMChildNode::getPreviousSibling(const DOMNode *thisNode) const {
    // if we are the firstChild, previousSibling actually refers to our
    // parent's lastChild, but we hide that
    return castToNodeImpl(thisNode)->isFirstChild() ? 0 : previousSibling;
}